

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_point_cloud.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar10;
  undefined1 auVar9 [16];
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM4_Qb;
  timeval tVar11;
  timeval tVar12;
  timeval tic;
  timeval toc;
  translation_t t_perturbed;
  points_t points2;
  points_t points1;
  vector<int,_std::allocator<int>_> indices3;
  translation_t position;
  MatrixXd gt;
  translation_t position1;
  translation_t position2;
  rotation_t rotation1;
  rotation_t R_perturbed;
  rotation_t rotation;
  transformation_t nonlinear_transformation;
  transformation_t threept_transformation_3;
  PointCloudAdapter adapter;
  transformation_t nonlinear_transformation_3;
  rotation_t rotation2;
  transformation_t threept_transformation;
  timeval local_530;
  timeval local_520;
  translation_t local_510;
  bearingVectors_t local_4f0;
  bearingVectors_t local_4d0;
  double local_4b0;
  double local_4a8;
  vector<int,_std::allocator<int>_> local_4a0;
  translation_t local_488;
  DenseStorage<double,__1,__1,__1,_0> local_470;
  translation_t local_450;
  Vector3d local_430;
  rotation_t local_418;
  rotation_t local_3d0;
  rotation_t local_388;
  transformation_t local_340;
  transformation_t local_2c0;
  PointCloudAdapter local_238;
  transformation_t local_1c0;
  Matrix3d local_148;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  
  opengv::initializeRandomSeed();
  local_450.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_450.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_450.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomTranslation(&local_430,2.0);
  opengv::generateRandomRotation(&local_148,0.5);
  local_4d0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_470.m_cols = 0;
  local_470.m_data = (double *)0x0;
  local_470.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_470,0x1e,3,10);
  opengv::generateRandom3D3DCorrespondences
            (&local_450,&local_418,&local_430,&local_148,10,0.05,0.0,&local_4d0,&local_4f0,
             (MatrixXd *)&local_470);
  opengv::extractRelativePose
            (&local_450,&local_430,&local_418,&local_148,&local_488,&local_388,false);
  opengv::printExperimentCharacteristics(&local_488,&local_388,0.05,0.0);
  opengv::point_cloud::PointCloudAdapter::PointCloudAdapter
            (&local_238,&local_4d0,&local_4f0,&local_488,&local_388);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running threept with all the points",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  gettimeofday(&local_530,(__timezone_ptr_t)0x0);
  lVar3 = 100;
  do {
    opengv::point_cloud::threept_arun(&local_2c0,&local_238.super_PointCloudAdapterBase);
    lVar3 = lVar3 + -1;
    dStack_c0 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[8];
    dStack_b8 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[9];
    dStack_b0 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[10];
    dStack_a8 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[0xb];
    local_100 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[0];
    dStack_f8 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[1];
    dStack_f0 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[2];
    dStack_e8 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[3];
    local_e0 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[4];
    dStack_d8 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[5];
    dStack_d0 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[6];
    dStack_c8 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[7];
  } while (lVar3 != 0);
  gettimeofday(&local_520,(__timezone_ptr_t)0x0);
  tVar11 = timeval_minus((timeval *)&local_520,(timeval *)&local_530);
  tVar12 = timeval_minus((timeval *)&local_520,(timeval *)&local_530);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running threept with three points only",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  opengv::getNindices(&local_4a0,3);
  auVar4._0_8_ = (double)tVar11.tv_sec;
  auVar4._8_8_ = in_XMM2_Qb;
  auVar7._0_8_ = (double)tVar12.tv_usec;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar4 = vfmadd132sd_fma(auVar7,auVar4,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_4a8 = auVar4._0_8_ / 100.0;
  gettimeofday(&local_530,(__timezone_ptr_t)0x0);
  lVar3 = 100;
  do {
    opengv::point_cloud::threept_arun(&local_340,&local_238.super_PointCloudAdapterBase,&local_4a0);
    lVar3 = lVar3 + -1;
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[8];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[9];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [10] = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[10];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [0xb] = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
            array[0xb];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[3];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[5];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7]
         = local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
  } while (lVar3 != 0);
  gettimeofday(&local_520,(__timezone_ptr_t)0x0);
  tVar11 = timeval_minus((timeval *)&local_520,(timeval *)&local_530);
  tVar12 = timeval_minus((timeval *)&local_520,(timeval *)&local_530);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed pose and ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"performing nonlinear optimization",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  opengv::getPerturbedPose(&local_488,&local_388,&local_510,&local_3d0,0.1);
  auVar5._0_8_ = (double)tVar11.tv_sec;
  auVar5._8_8_ = in_XMM2_Qb;
  auVar8._0_8_ = (double)tVar12.tv_usec;
  auVar8._8_8_ = in_XMM4_Qb;
  auVar4 = vfmadd132sd_fma(auVar8,auVar5,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_4b0 = auVar4._0_8_ / 100.0;
  local_238.super_PointCloudAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_510.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_238.super_PointCloudAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_510.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_238.super_PointCloudAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_510.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  gettimeofday(&local_530,(__timezone_ptr_t)0x0);
  lVar3 = 100;
  do {
    opengv::point_cloud::optimize_nonlinear(&local_1c0,&local_238.super_PointCloudAdapterBase);
    lVar3 = lVar3 + -1;
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[8];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[9];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [10] = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[10];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [0xb] = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
            array[0xb];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[3];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[5];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7]
         = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
  } while (lVar3 != 0);
  gettimeofday(&local_520,(__timezone_ptr_t)0x0);
  tVar11 = timeval_minus((timeval *)&local_520,(timeval *)&local_530);
  tVar12 = timeval_minus((timeval *)&local_520,(timeval *)&local_530);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed pose and ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"performing nonlinear optimization with three points only",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  opengv::getPerturbedPose(&local_488,&local_388,&local_510,&local_3d0,0.01);
  local_238.super_PointCloudAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_510.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_238.super_PointCloudAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_510.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_238.super_PointCloudAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_510.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_238.super_PointCloudAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  opengv::point_cloud::optimize_nonlinear
            (&local_1c0,&local_238.super_PointCloudAdapterBase,&local_4a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from threept_arun algorithm:",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_100);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from threept_arun with 3 points only:",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_2c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results of nonlinear optimization:",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_340);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results of nonlinear optimization with 3 points only:",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_1c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from threept_arun algorithm: ",0x25);
  poVar1 = std::ostream::_M_insert<double>(local_4a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from threept_arun algorithm with 3 points only: ",0x38);
  poVar1 = std::ostream::_M_insert<double>(local_4b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  uVar10 = extraout_XMM1_Qb;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timing of nonlinear optimization: ",0x22);
  auVar6._0_8_ = (double)tVar11.tv_sec;
  auVar6._8_8_ = uVar10;
  auVar9._0_8_ = (double)tVar12.tv_usec;
  auVar9._8_8_ = uVar10;
  auVar4 = vfmadd132sd_fma(auVar9,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar1 = std::ostream::_M_insert<double>(auVar4._0_8_ / 100.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  opengv::point_cloud::PointCloudAdapter::~PointCloudAdapter(&local_238);
  if (local_470.m_data != (double *)0x0) {
    free((void *)local_470.m_data[-1]);
  }
  if (local_4f0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_4f0.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (local_4d0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_4d0.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.05;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //derive the correspondences based on random point-cloud
  points_t points1;
  points_t points2;
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom3D3DCorrespondences(
      position1, rotation1, position2, rotation2,
      numberPoints, noise, outlierFraction, points1, points2, gt );
    
  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation, false );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create the point-cloud adapter
  point_cloud::PointCloudAdapter adapter(
      points1, points2, position, rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 100;

  //run experiments
  std::cout << "running threept with all the points" << std::endl;
  transformation_t threept_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    threept_transformation = point_cloud::threept_arun(adapter);
  gettimeofday( &toc, 0 );
  double threept_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running threept with three points only" << std::endl;
  std::vector<int> indices3 = getNindices(3);
  transformation_t threept_transformation_3;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    threept_transformation_3 = point_cloud::threept_arun(adapter,indices3);
  gettimeofday( &toc, 0 );
  double threept_time_3 = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  //add a small perturbation to the rotation
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    nonlinear_transformation = point_cloud::optimize_nonlinear(adapter);
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with three points only";
  std::cout << std::endl;
  //add a small perturbation to the rotation
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation_3 =
      point_cloud::optimize_nonlinear(adapter,indices3);

  //print results
  std::cout << "results from threept_arun algorithm:" << std::endl;
  std::cout << threept_transformation << std::endl << std::endl;
  std::cout << "results from threept_arun with 3 points only:" << std::endl;
  std::cout << threept_transformation_3 << std::endl << std::endl;
  std::cout << "results of nonlinear optimization:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results of nonlinear optimization with 3 points only:" << std::endl;
  std::cout << nonlinear_transformation_3 << std::endl << std::endl;

  std::cout << "timings from threept_arun algorithm: ";
  std::cout << threept_time << std::endl;
  std::cout << "timings from threept_arun algorithm with 3 points only: ";
  std::cout << threept_time_3 << std::endl;
  std::cout << "timing of nonlinear optimization: ";
  std::cout << nonlinear_time << std::endl;
}